

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::loops_plusloop(Forth *this)

{
  uint uVar1;
  Cell i;
  int iVar2;
  int iVar3;
  
  data(this,0x10);
  data(this,6);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->controlStackLoops);
  ForthStack<unsigned_int>::pop(&this->controlStackLoops);
  data(this,uVar1 - this->dataPointer);
  iVar3 = this->CellSize * 3 + uVar1;
  uVar1 = this->dataPointer - iVar3;
  iVar2 = 0;
  do {
    dataSpaceSet(this,iVar3 + iVar2,(Char)uVar1);
    uVar1 = uVar1 >> 8;
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  data(this,9);
  return;
}

Assistant:

void loops_plusloop(){
#ifdef PLUSLOOP_SIMPLE_AND_DIRTY 
			data(rFrom_Xt);
			data(rFrom_Xt);
			data(rotXt);
			data(plusXt);
			data(DupDupXt);
			data(EqualsXt);
#else 
			data(plusLoopCheckXt);
#endif
			data(zbranchXt);
			auto cell = controlStackLoops.getTop(); controlStackLoops.pop();
			data(cell - getDataPointer());
			// calculate return point after LEAVE and save it to second BRANCH in DO
			auto offset = getDataPointer() - (cell + CellSize * 3);
			setDataCell(cell + CellSize * 3, Cell(offset));
			data(DropDropXt);
		}